

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc.cpp
# Opt level: O1

void flatbuffers::AppendOption
               (stringstream *ss,FlatCOption *option,size_t max_col,size_t min_col_for_description)

{
  ostream *poVar1;
  size_type sVar2;
  pointer pcVar3;
  ostream *poVar4;
  ulong uVar5;
  string description;
  string local_48;
  
  poVar1 = (ostream *)(ss + 0x10);
  uVar5 = 2;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
  sVar2 = (option->short_opt)._M_string_length;
  if (sVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"-",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,(option->short_opt)._M_dataplus._M_p,(option->short_opt)._M_string_length);
    if ((option->long_opt)._M_string_length == 0) {
      uVar5 = sVar2 + 4;
    }
    else {
      uVar5 = sVar2 + 5;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  }
  sVar2 = (option->long_opt)._M_string_length;
  if (sVar2 != 0) {
    uVar5 = uVar5 + sVar2 + 3;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"--",2);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,(option->long_opt)._M_dataplus._M_p,
                        (option->long_opt)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  }
  sVar2 = (option->parameter)._M_string_length;
  if (sVar2 != 0) {
    uVar5 = uVar5 + sVar2 + 1;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,(option->parameter)._M_dataplus._M_p,sVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  }
  if (uVar5 < 0x1a) {
    if (uVar5 != 0x19) {
      uVar5 = uVar5 - 1;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
        uVar5 = uVar5 + 1;
      } while (uVar5 < 0x18);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_48,'\x19');
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,local_48._M_dataplus._M_p,local_48._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  sVar2 = (option->description)._M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (option->description)._M_dataplus._M_p;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_48,pcVar3,pcVar3 + sVar2);
    AppendTextWrappedString(ss,&local_48,0x19,min_col_for_description);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  return;
}

Assistant:

static void AppendOption(std::stringstream &ss, const FlatCOption &option,
                         size_t max_col, size_t min_col_for_description) {
  size_t chars = 2;
  ss << "  ";
  if (!option.short_opt.empty()) {
    chars += 2 + option.short_opt.length();
    ss << "-" << option.short_opt;
    if (!option.long_opt.empty()) {
      chars++;
      ss << ",";
    }
    ss << " ";
  }
  if (!option.long_opt.empty()) {
    chars += 3 + option.long_opt.length();
    ss << "--" << option.long_opt << " ";
  }
  if (!option.parameter.empty()) {
    chars += 1 + option.parameter.length();
    ss << option.parameter << " ";
  }
  size_t start_of_description = chars;
  if (start_of_description > min_col_for_description) {
    ss << "\n";
    start_of_description = min_col_for_description;
    ss << std::string(start_of_description, ' ');
  } else {
    while (start_of_description < min_col_for_description) {
      ss << " ";
      start_of_description++;
    }
  }
  if (!option.description.empty()) {
    std::string description = option.description;
    AppendTextWrappedString(ss, description, max_col, start_of_description);
  }
  ss << "\n";
}